

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EndsWithMatch.cpp
# Opt level: O2

unique_ptr<const_oout::Result,_std::default_delete<const_oout::Result>_> __thiscall
oout::EndsWithMatch::match(EndsWithMatch *this,shared_ptr<const_oout::Text> *in)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *__rhs;
  undefined8 uVar1;
  ostream *poVar2;
  undefined8 *in_RDX;
  string origin;
  ostringstream message;
  undefined1 local_20a [2];
  bool local_208 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_200;
  undefined1 local_1f8 [16];
  long local_1e8;
  string local_1d0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  ostringstream local_190 [376];
  
  (**(code **)(*(long *)*in_RDX + 0x10))(local_1f8 + 8);
  std::__cxx11::ostringstream::ostringstream(local_190);
  poVar2 = std::operator<<((ostream *)local_190,"\'");
  poVar2 = std::operator<<(poVar2,(string *)(local_1f8 + 8));
  poVar2 = std::operator<<(poVar2,"\' ends with \'");
  __rhs = &(in->super___shared_ptr<const_oout::Text,_(__gnu_cxx::_Lock_policy)2>)._M_refcount;
  poVar2 = std::operator<<(poVar2,(string *)__rhs);
  std::operator<<(poVar2,"\'");
  std::__cxx11::string::string
            ((string *)&local_1b0,(string *)(local_1f8 + 8),
             local_1e8 -
             (long)in[1].super___shared_ptr<const_oout::Text,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             (allocator *)(local_20a + 1));
  local_20a[0] = std::operator==(&local_1b0,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)__rhs);
  std::__cxx11::stringbuf::str();
  std::make_shared<oout::CondResult,bool,std::__cxx11::string>
            (local_208,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_20a);
  std::make_unique<oout::TestResult,std::shared_ptr<oout::CondResult>>
            ((shared_ptr<oout::CondResult> *)local_1f8);
  uVar1 = local_1f8._0_8_;
  local_1f8._0_8_ = 0;
  (this->super_Match)._vptr_Match = (_func_int **)uVar1;
  std::unique_ptr<oout::TestResult,_std::default_delete<oout::TestResult>_>::~unique_ptr
            ((unique_ptr<oout::TestResult,_std::default_delete<oout::TestResult>_> *)local_1f8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_200);
  std::__cxx11::string::~string(local_1d0);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::__cxx11::ostringstream::~ostringstream(local_190);
  std::__cxx11::string::~string((string *)(local_1f8 + 8));
  return (__uniq_ptr_data<const_oout::Result,_std::default_delete<const_oout::Result>,_true,_true>)
         (__uniq_ptr_data<const_oout::Result,_std::default_delete<const_oout::Result>,_true,_true>)
         this;
}

Assistant:

unique_ptr<const Result> EndsWithMatch::match(const shared_ptr<const Text> &in) const
{
	const auto origin = in->asString();
	ostringstream message;
	message << "'" << origin << "' ends with '" << text << "'";

	return make_unique<TestResult>(
		make_shared<CondResult>(
			string(origin, origin.size() - text.size()) == text,
			message.str()
		)
	);
}